

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

void crnlib::SkipMatchesSpec
               (UInt32 lenLimit,UInt32 curMatch,UInt32 pos,Byte *cur,CLzRef *son,
               UInt32 _cyclicBufferPos,UInt32 _cyclicBufferSize,UInt32 cutValue)

{
  uint uVar1;
  UInt32 *pUVar2;
  uint local_78;
  UInt32 local_74;
  uint local_64;
  UInt32 len;
  Byte *pb;
  CLzRef *pair;
  uint local_48;
  UInt32 delta;
  UInt32 len1;
  UInt32 len0;
  CLzRef *ptr1;
  CLzRef *ptr0;
  UInt32 _cyclicBufferPos_local;
  CLzRef *son_local;
  Byte *cur_local;
  UInt32 local_10;
  UInt32 pos_local;
  UInt32 curMatch_local;
  UInt32 lenLimit_local;
  
  _len1 = son + (_cyclicBufferPos << 1);
  delta = 0;
  local_48 = 0;
  ptr1 = son + (ulong)(_cyclicBufferPos << 1) + 1;
  local_10 = curMatch;
  do {
    uVar1 = pos - local_10;
    if ((cutValue == 0) || (_cyclicBufferSize <= uVar1)) {
      *_len1 = 0;
      *ptr1 = 0;
      return;
    }
    if (_cyclicBufferPos < uVar1) {
      local_74 = _cyclicBufferSize;
    }
    else {
      local_74 = 0;
    }
    pUVar2 = son + ((_cyclicBufferPos - uVar1) + local_74) * 2;
    if (delta < local_48) {
      local_78 = delta;
    }
    else {
      local_78 = local_48;
    }
    local_64 = local_78;
    if (cur[(ulong)local_78 - (ulong)uVar1] == cur[local_78]) {
      do {
        local_64 = local_64 + 1;
        if (local_64 == lenLimit) break;
      } while (cur[(ulong)local_64 - (ulong)uVar1] == cur[local_64]);
      if (local_64 == lenLimit) {
        *_len1 = *pUVar2;
        *ptr1 = pUVar2[1];
        return;
      }
    }
    if (cur[(ulong)local_64 - (ulong)uVar1] < cur[local_64]) {
      *_len1 = local_10;
      _len1 = pUVar2 + 1;
      local_10 = *_len1;
      local_48 = local_64;
      cutValue = cutValue - 1;
    }
    else {
      *ptr1 = local_10;
      local_10 = *pUVar2;
      delta = local_64;
      cutValue = cutValue - 1;
      ptr1 = pUVar2;
    }
  } while( true );
}

Assistant:

static void SkipMatchesSpec(UInt32 lenLimit, UInt32 curMatch, UInt32 pos, const Byte* cur, CLzRef* son,
                            UInt32 _cyclicBufferPos, UInt32 _cyclicBufferSize, UInt32 cutValue) {
  CLzRef* ptr0 = son + (_cyclicBufferPos << 1) + 1;
  CLzRef* ptr1 = son + (_cyclicBufferPos << 1);
  UInt32 len0 = 0, len1 = 0;
  for (;;) {
    UInt32 delta = pos - curMatch;
    if (cutValue-- == 0 || delta >= _cyclicBufferSize) {
      *ptr0 = *ptr1 = kEmptyHashValue;
      return;
    }
    {
      CLzRef* pair = son + ((_cyclicBufferPos - delta + ((delta > _cyclicBufferPos) ? _cyclicBufferSize : 0)) << 1);
      const Byte* pb = cur - delta;
      UInt32 len = (len0 < len1 ? len0 : len1);
      if (pb[len] == cur[len]) {
        while (++len != lenLimit)
          if (pb[len] != cur[len])
            break;
        {
          if (len == lenLimit) {
            *ptr1 = pair[0];
            *ptr0 = pair[1];
            return;
          }
        }
      }
      if (pb[len] < cur[len]) {
        *ptr1 = curMatch;
        ptr1 = pair + 1;
        curMatch = *ptr1;
        len1 = len;
      } else {
        *ptr0 = curMatch;
        ptr0 = pair;
        curMatch = *ptr0;
        len0 = len;
      }
    }
  }
}